

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall FileEntryInfo::addExtent(FileEntryInfo *this,Extent *extent)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  pointer pEVar4;
  undefined1 local_40 [16];
  undefined1 local_30 [20];
  int local_1c;
  Extent *pEStack_18;
  int lastLBN;
  Extent *extent_local;
  FileEntryInfo *this_local;
  
  pEStack_18 = extent;
  extent_local = (Extent *)this;
  bVar3 = std::vector<Extent,_std::allocator<Extent>_>::empty(&this->m_extents);
  if (bVar3) {
    std::vector<Extent,_std::allocator<Extent>_>::push_back(&this->m_extents,pEStack_18);
  }
  else {
    std::vector<Extent,_std::allocator<Extent>_>::rbegin
              ((vector<Extent,_std::allocator<Extent>_> *)(local_30 + 8));
    pEVar4 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<Extent_*,_std::vector<Extent,_std::allocator<Extent>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Extent_*,_std::vector<Extent,_std::allocator<Extent>_>_>_>
                           *)(local_30 + 8));
    iVar1 = pEVar4->lbnPos;
    std::vector<Extent,_std::allocator<Extent>_>::rbegin
              ((vector<Extent,_std::allocator<Extent>_> *)local_30);
    pEVar4 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<Extent_*,_std::vector<Extent,_std::allocator<Extent>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Extent_*,_std::vector<Extent,_std::allocator<Extent>_>_>_>
                           *)local_30);
    local_1c = iVar1 + (int)(pEVar4->size / 0x800);
    bVar3 = false;
    if (local_1c == pEStack_18->lbnPos) {
      std::vector<Extent,_std::allocator<Extent>_>::rbegin
                ((vector<Extent,_std::allocator<Extent>_> *)(local_40 + 8));
      pEVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<Extent_*,_std::vector<Extent,_std::allocator<Extent>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Extent_*,_std::vector<Extent,_std::allocator<Extent>_>_>_>
                             *)(local_40 + 8));
      bVar3 = pEVar4->size + pEStack_18->size < 0x40000000;
    }
    if (bVar3) {
      lVar2 = pEStack_18->size;
      std::vector<Extent,_std::allocator<Extent>_>::rbegin
                ((vector<Extent,_std::allocator<Extent>_> *)local_40);
      pEVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<Extent_*,_std::vector<Extent,_std::allocator<Extent>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Extent_*,_std::vector<Extent,_std::allocator<Extent>_>_>_>
                             *)local_40);
      pEVar4->size = lVar2 + pEVar4->size;
    }
    else {
      std::vector<Extent,_std::allocator<Extent>_>::push_back(&this->m_extents,pEStack_18);
    }
  }
  this->m_fileSize = pEStack_18->size + this->m_fileSize;
  return;
}

Assistant:

void FileEntryInfo::addExtent(const Extent &extent)
{
    if (m_extents.empty())
    {
        m_extents.push_back(extent);
    }
    else
    {
        const int lastLBN = m_extents.rbegin()->lbnPos + static_cast<int>(m_extents.rbegin()->size / SECTOR_SIZE);
        if (lastLBN == extent.lbnPos && m_extents.rbegin()->size + extent.size < MAX_EXTENT_SIZE)
            m_extents.rbegin()->size += extent.size;
        else
            m_extents.push_back(extent);
    }
    m_fileSize += extent.size;
}